

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ReservedFieldNumbersFailAsExtension_Test::
CommandLineInterfaceTest_ReservedFieldNumbersFailAsExtension_Test
          (CommandLineInterfaceTest_ReservedFieldNumbersFailAsExtension_Test *this)

{
  CommandLineInterfaceTest_ReservedFieldNumbersFailAsExtension_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)
       &PTR__CommandLineInterfaceTest_ReservedFieldNumbersFailAsExtension_Test_029fdf20;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ReservedFieldNumbersFailAsExtension) {
  CreateTempFile("foo.proto",
                 R"(
syntax = "proto2";
message Foo {
  extensions 4 to max;
}
extend Foo {
  optional int32 i = 19123;
}
)");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto");

  ExpectErrorSubstring(
      "foo.proto: Field numbers 19000 through 19999 are reserved for the "
      "protocol buffer library implementation.");

  CreateTempFile("foo.proto",
                 R"(
syntax = "proto2";
message Foo {
  extensions 4 to max;
}
message Bar {
  extend Foo {
    optional int32 i = 19123;
  }
}
)");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto");

  ExpectErrorSubstring(
      "foo.proto: Field numbers 19000 through 19999 are reserved for the "
      "protocol buffer library implementation.");
}